

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O1

void jpeg_idct_5x5(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSAMPLE *pJVar4;
  void *pvVar5;
  JSAMPROW pJVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int aiStack_98 [10];
  int workspace [25];
  
  pJVar4 = cinfo->sample_range_limit;
  pvVar5 = compptr->dct_table;
  lVar11 = 0;
  do {
    lVar16 = (long)*(short *)((long)pvVar5 + lVar11 * 2) * (long)coef_block[lVar11] * 0x2000;
    lVar18 = (long)*(short *)((long)pvVar5 + lVar11 * 2 + 0x20) * (long)coef_block[lVar11 + 0x10];
    lVar9 = (long)*(short *)((long)pvVar5 + lVar11 * 2 + 0x40) * (long)coef_block[lVar11 + 0x20];
    lVar17 = lVar9 + lVar18;
    lVar18 = lVar18 - lVar9;
    lVar15 = lVar18 * 0xb50 + lVar16 + 0x400;
    lVar9 = lVar15 + lVar17 * 0x194c;
    lVar15 = lVar15 + lVar17 * -0x194c;
    lVar20 = (long)*(short *)((long)pvVar5 + lVar11 * 2 + 0x10) * (long)coef_block[lVar11 + 8];
    lVar17 = (long)*(short *)((long)pvVar5 + lVar11 * 2 + 0x30) * (long)coef_block[lVar11 + 0x18];
    lVar19 = (lVar17 + lVar20) * 0x1a9a;
    lVar20 = lVar20 * 0x1071 + lVar19;
    lVar19 = lVar17 * -0x45a4 + lVar19;
    aiStack_98[lVar11] = (int)((ulong)(lVar20 + lVar9) >> 0xb);
    workspace[lVar11 + 10] = (int)((ulong)(lVar9 - lVar20) >> 0xb);
    aiStack_98[lVar11 + 5] = (int)((ulong)(lVar19 + lVar15) >> 0xb);
    workspace[lVar11 + 5] = (int)((ulong)(lVar15 - lVar19) >> 0xb);
    workspace[lVar11] = (int)(lVar16 + lVar18 * 0x7ffffffd2c0 + 0x400U >> 0xb);
    lVar11 = lVar11 + 1;
  } while ((int)lVar11 != 5);
  uVar7 = (ulong)output_col;
  lVar11 = 0;
  do {
    iVar8 = *(int *)((long)aiStack_98 + lVar11 + 4);
    iVar14 = *(int *)((long)aiStack_98 + lVar11 + 8);
    iVar2 = *(int *)((long)aiStack_98 + lVar11 + 0x10);
    iVar12 = *(int *)((long)aiStack_98 + lVar11) * 0x2000;
    iVar1 = iVar2 + iVar14;
    iVar14 = iVar14 - iVar2;
    iVar13 = iVar14 * 0xb50 + iVar12 + 0x20000;
    iVar3 = *(int *)((long)aiStack_98 + lVar11 + 0xc);
    iVar2 = iVar13 + iVar1 * 0x194c;
    iVar10 = (iVar3 + iVar8) * 0x1a9a;
    iVar8 = iVar8 * 0x1071 + iVar10;
    iVar10 = iVar3 * -0x45a4 + iVar10;
    pJVar6 = *output_buf;
    pJVar6[uVar7] = pJVar4[(ulong)((uint)(iVar8 + iVar2) >> 0x12 & 0x3ff) + 0x80];
    iVar13 = iVar13 + iVar1 * -0x194c;
    pJVar6[uVar7 + 4] = pJVar4[(ulong)((uint)(iVar2 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar7 + 1] = pJVar4[(ulong)((uint)(iVar10 + iVar13) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar7 + 3] = pJVar4[(ulong)((uint)(iVar13 - iVar10) >> 0x12 & 0x3ff) + 0x80];
    pJVar6[uVar7 + 2] =
         pJVar4[(ulong)(iVar12 + iVar14 * 0xfffd2c0 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
    output_buf = output_buf + 1;
    lVar11 = lVar11 + 0x14;
  } while (lVar11 != 100);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_5x5(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp10, tmp11, tmp12;
  JLONG z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[5 * 5];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp12 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp12 = LEFT_SHIFT(tmp12, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp12 += ONE << (CONST_BITS - PASS1_BITS - 1);
    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z1 = MULTIPLY(tmp0 + tmp1, FIX(0.790569415)); /* (c2+c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.353553391)); /* (c2-c4)/2 */
    z3 = tmp12 + z2;
    tmp10 = z3 + z1;
    tmp11 = z3 - z1;
    tmp12 -= LEFT_SHIFT(z2, 2);

    /* Odd part */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));     /* c3 */
    tmp0 = z1 + MULTIPLY(z2, FIX(0.513743148));   /* c1-c3 */
    tmp1 = z1 - MULTIPLY(z3, FIX(2.176250899));   /* c1+c3 */

    /* Final output stage */

    wsptr[5 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[5 * 4] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[5 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[5 * 3] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[5 * 2] = (int)RIGHT_SHIFT(tmp12, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 5 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp12 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp12 = LEFT_SHIFT(tmp12, CONST_BITS);
    tmp0 = (JLONG)wsptr[2];
    tmp1 = (JLONG)wsptr[4];
    z1 = MULTIPLY(tmp0 + tmp1, FIX(0.790569415)); /* (c2+c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.353553391)); /* (c2-c4)/2 */
    z3 = tmp12 + z2;
    tmp10 = z3 + z1;
    tmp11 = z3 - z1;
    tmp12 -= LEFT_SHIFT(z2, 2);

    /* Odd part */

    z2 = (JLONG)wsptr[1];
    z3 = (JLONG)wsptr[3];

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));     /* c3 */
    tmp0 = z1 + MULTIPLY(z2, FIX(0.513743148));   /* c1-c3 */
    tmp1 = z1 - MULTIPLY(z3, FIX(2.176250899));   /* c1+c3 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 5;         /* advance pointer to next row */
  }
}